

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

bool __thiscall
KeyStore::load(KeyStore *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *keystore,
              string *pass)

{
  size_type sVar1;
  undefined1 local_48 [8];
  MemBuffer buf;
  string *pass_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *keystore_local;
  KeyStore *this_local;
  
  buf.readpos = (uint64_t)pass;
  asn1::MemBuffer::MemBuffer((MemBuffer *)local_48,keystore);
  sVar1 = asn1::MemBuffer::size((MemBuffer *)local_48);
  if (sVar1 < 0xc) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = load(this,(MemBuffer *)local_48,(string *)buf.readpos);
  }
  asn1::MemBuffer::~MemBuffer((MemBuffer *)local_48);
  return this_local._7_1_;
}

Assistant:

bool KeyStore::load(const std::vector<uint8_t>& keystore,
                    const std::string& pass)
{
    MemBuffer buf(keystore);
    if (buf.size() < 12)
        return false;
    return load(buf, pass);
}